

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

void __thiscall deqp::gls::VertexArrayTest::deinit(VertexArrayTest *this)

{
  ReferenceContextBuffers *this_00;
  
  if (this->m_glArrayPack != (ContextArrayPack *)0x0) {
    (*this->m_glArrayPack->_vptr_ContextArrayPack[1])();
  }
  if (this->m_rrArrayPack != (ContextArrayPack *)0x0) {
    (*this->m_rrArrayPack->_vptr_ContextArrayPack[1])();
  }
  this_00 = this->m_refBuffers;
  if (this_00 != (ReferenceContextBuffers *)0x0) {
    tcu::TextureLevel::~TextureLevel(&this_00->m_stencilbuffer);
    tcu::TextureLevel::~TextureLevel(&this_00->m_depthbuffer);
    tcu::TextureLevel::~TextureLevel(&this_00->m_colorbuffer);
  }
  operator_delete(this_00,0x78);
  if (this->m_refContext != (ReferenceContext *)0x0) {
    (*(this->m_refContext->super_Context)._vptr_Context[1])();
  }
  if (this->m_glesContext != (Context *)0x0) {
    (*this->m_glesContext->_vptr_Context[1])();
  }
  this->m_glesContext = (Context *)0x0;
  this->m_glArrayPack = (ContextArrayPack *)0x0;
  this->m_refBuffers = (ReferenceContextBuffers *)0x0;
  this->m_refContext = (ReferenceContext *)0x0;
  this->m_rrArrayPack = (ContextArrayPack *)0x0;
  return;
}

Assistant:

void VertexArrayTest::deinit (void)
{
	delete m_glArrayPack;
	delete m_rrArrayPack;
	delete m_refBuffers;
	delete m_refContext;
	delete m_glesContext;

	m_glArrayPack	= DE_NULL;
	m_rrArrayPack	= DE_NULL;
	m_refBuffers	= DE_NULL;
	m_refContext	= DE_NULL;
	m_glesContext	= DE_NULL;
}